

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Sector_SetRotation
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  sector_t *psVar1;
  uint uVar2;
  FSectorTagIterator local_30;
  double local_28;
  double local_20;
  
  if (arg0 == 0) {
    local_30.start = 0;
  }
  else {
    local_30.start = tagManager.TagHashFirst[(ulong)(uint)arg0 & 0xff];
  }
  local_30.searchtag = arg0;
  uVar2 = FSectorTagIterator::Next(&local_30);
  if (-1 < (int)uVar2) {
    local_20 = (double)arg2;
    local_28 = (double)arg1;
    do {
      psVar1 = sectors;
      sectors[uVar2].planes[0].xform.Angle.Degrees = local_28;
      psVar1[uVar2].planes[1].xform.Angle.Degrees = local_20;
      uVar2 = FSectorTagIterator::Next(&local_30);
    } while (-1 < (int)uVar2);
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetRotation)
// Sector_SetRotation (tag, floor-angle, ceiling-angle)
{
	DAngle ceiling = (double)arg2;
	DAngle floor = (double)arg1;

	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		sectors[secnum].SetAngle(sector_t::floor, floor);
		sectors[secnum].SetAngle(sector_t::ceiling, ceiling);
	}
	return true;
}